

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O2

int start_packet(vorb *f)

{
  int iVar1;
  
  while( true ) {
    if (f->next_seg != -1) {
      f->last_seg = 0;
      f->valid_bits = 0;
      f->packet_bytes = 0;
      f->bytes_in_seg = '\0';
      return 1;
    }
    iVar1 = start_page(f);
    if (iVar1 == 0) break;
    if ((f->page_flag & 1) != 0) {
      f->error = VORBIS_continued_packet_flag_invalid;
      return 0;
    }
  }
  return 0;
}

Assistant:

static int start_packet(vorb *f)
{
   while (f->next_seg == -1) {
      if (!start_page(f)) return FALSE;
      if (f->page_flag & PAGEFLAG_continued_packet)
         return error(f, VORBIS_continued_packet_flag_invalid);
   }
   f->last_seg = FALSE;
   f->valid_bits = 0;
   f->packet_bytes = 0;
   f->bytes_in_seg = 0;
   // f->next_seg is now valid
   return TRUE;
}